

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void xm_create_context_from_libxmize(xm_context_t **ctxp,char *libxmized,uint32_t rate)

{
  xm_instrument_t **ppxVar1;
  uint8_t **ppuVar2;
  xm_channel_context_t **ppxVar3;
  long *plVar4;
  char *pcVar5;
  short *psVar6;
  anon_union_8_2_8127e1e2_for_xm_sample_s_11 *paVar7;
  xm_sample_t **ppxVar8;
  int8_t *piVar9;
  xm_context_t *pxVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  xm_instrument_t *pxVar14;
  ulong uVar15;
  ulong uVar16;
  xm_sample_t *pxVar17;
  
  *ctxp = (xm_context_t *)libxmized;
  *(char **)(libxmized + 0x118) = libxmized + *(long *)(libxmized + 0x118);
  ppxVar1 = &((*ctxp)->module).instruments;
  *ppxVar1 = (xm_instrument_t *)
             (((*ctxp)->module).pattern_table + (long)((*ppxVar1)->sample_of_notes + -10) + -0x10);
  ppuVar2 = &(*ctxp)->row_loop_count;
  *ppuVar2 = *ppuVar2 + (long)*ctxp;
  ppxVar3 = &(*ctxp)->channels;
  *ppxVar3 = (xm_channel_context_t *)
             (((*ctxp)->module).pattern_table + (long)((*ppxVar3)[-1].actual_volume + -4));
  pxVar10 = *ctxp;
  if ((pxVar10->module).num_patterns != 0) {
    lVar11 = 8;
    uVar12 = 0;
    do {
      plVar4 = (long *)((long)&((pxVar10->module).patterns)->num_rows + lVar11);
      *plVar4 = (long)((pxVar10->module).pattern_table + *plVar4 + -0x18);
      uVar12 = uVar12 + 1;
      pxVar10 = *ctxp;
      lVar11 = lVar11 + 0x10;
    } while (uVar12 < (pxVar10->module).num_patterns);
  }
  pxVar10 = *ctxp;
  if ((pxVar10->module).num_instruments != 0) {
    uVar12 = 0;
    do {
      ppxVar8 = &(pxVar10->module).instruments[uVar12].samples;
      *ppxVar8 = (xm_sample_t *)((pxVar10->module).pattern_table + (long)&(*ppxVar8)[-1].panning);
      pxVar10 = *ctxp;
      pxVar14 = (pxVar10->module).instruments;
      if (pxVar14[uVar12].num_samples != 0) {
        uVar13 = 0;
        do {
          paVar7 = &pxVar14[uVar12].samples[uVar13].field_11;
          paVar7->data8 = paVar7->data8 + (long)pxVar10;
          pxVar17 = ((*ctxp)->module).instruments[uVar12].samples;
          uVar16 = (ulong)pxVar17[uVar13].length;
          if (1 < uVar16) {
            pxVar17 = pxVar17 + uVar13;
            if (pxVar17->bits == '\b') {
              pxVar17 = ((*ctxp)->module).instruments[uVar12].samples;
              if (1 < pxVar17[uVar13].length) {
                uVar16 = 1;
                do {
                  pcVar5 = pxVar17[uVar13].field_11.data8 + uVar16;
                  *pcVar5 = *pcVar5 + pxVar17[uVar13].field_11.data8[uVar16 - 1];
                  uVar16 = uVar16 + 1;
                  pxVar17 = ((*ctxp)->module).instruments[uVar12].samples;
                } while (uVar16 < pxVar17[uVar13].length);
              }
            }
            else {
              uVar15 = 1;
              do {
                piVar9 = (pxVar17->field_11).data8;
                psVar6 = (short *)(piVar9 + uVar15 * 2);
                *psVar6 = *psVar6 + *(short *)(piVar9 + uVar15 * 2 + -2);
                uVar15 = uVar15 + 1;
              } while (uVar16 != uVar15);
            }
          }
          uVar13 = uVar13 + 1;
          pxVar10 = *ctxp;
          pxVar14 = (pxVar10->module).instruments;
        } while (uVar13 < pxVar14[uVar12].num_samples);
      }
      uVar12 = uVar12 + 1;
      pxVar10 = *ctxp;
    } while (uVar12 < (pxVar10->module).num_instruments);
  }
  return;
}

Assistant:

void xm_create_context_from_libxmize(xm_context_t** ctxp, char* libxmized, uint32_t rate) {
	size_t i, j;

	*ctxp = (void*)libxmized;

	/* Reverse steps of libxmize.c */
	OFFSET((*ctxp)->module.patterns);
	OFFSET((*ctxp)->module.instruments);
	OFFSET((*ctxp)->row_loop_count);
	OFFSET((*ctxp)->channels);

	for(i = 0; i < (*ctxp)->module.num_patterns; ++i) {
		OFFSET((*ctxp)->module.patterns[i].slots);
	}

	for(i = 0; i < (*ctxp)->module.num_instruments; ++i) {
		OFFSET((*ctxp)->module.instruments[i].samples);

		for(j = 0; j < (*ctxp)->module.instruments[i].num_samples; ++j) {
			OFFSET((*ctxp)->module.instruments[i].samples[j].data8);

			if(XM_LIBXMIZE_DELTA_SAMPLES) {
				if((*ctxp)->module.instruments[i].samples[j].length > 1) {
					if((*ctxp)->module.instruments[i].samples[j].bits == 8) {
						for(size_t k = 1; k < (*ctxp)->module.instruments[i].samples[j].length; ++k) {
							(*ctxp)->module.instruments[i].samples[j].data8[k] += (*ctxp)->module.instruments[i].samples[j].data8[k-1];
						}
					} else {
						for(size_t k = 1; k < (*ctxp)->module.instruments[i].samples[j].length; ++k) {
							(*ctxp)->module.instruments[i].samples[j].data16[k] += (*ctxp)->module.instruments[i].samples[j].data16[k-1];
						}
					}
				}
			}
		}
	}
}